

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O0

WebAssemblyArrayBuffer *
Js::WebAssemblyArrayBuffer::Create(byte *buffer,uint32 length,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this;
  Recycler *pRVar3;
  WebAssemblyArrayBuffer *pWVar4;
  undefined4 *puVar5;
  TrackAllocData local_90;
  code *local_68;
  undefined8 local_60;
  TrackAllocData local_58;
  WebAssemblyArrayBuffer *local_30;
  WebAssemblyArrayBuffer *result;
  Recycler *recycler;
  DynamicType *type_local;
  byte *pbStack_10;
  uint32 length_local;
  byte *buffer_local;
  
  recycler = (Recycler *)type;
  type_local._4_4_ = length;
  pbStack_10 = buffer;
  this = Js::Type::GetScriptContext(&type->super_Type);
  pRVar3 = ScriptContext::GetRecycler(this);
  local_30 = (WebAssemblyArrayBuffer *)0x0;
  result = (WebAssemblyArrayBuffer *)pRVar3;
  if (pbStack_10 == (byte *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_90,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
               ,0x41a);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_90);
    pWVar4 = (WebAssemblyArrayBuffer *)new<Memory::Recycler>(0x48,pRVar3,0x4642b0);
    WebAssemblyArrayBuffer(pWVar4,type_local._4_4_,(DynamicType *)recycler);
    local_30 = pWVar4;
  }
  else {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
               ,0x40e);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_58);
    local_68 = Memory::Recycler::AllocFinalizedInlined;
    local_60 = 0;
    pWVar4 = (WebAssemblyArrayBuffer *)new<Memory::Recycler>(0x48,pRVar3,0x4642b0);
    WebAssemblyArrayBuffer(pWVar4,pbStack_10,type_local._4_4_,(DynamicType *)recycler);
    local_30 = pWVar4;
  }
  Memory::Recycler::AddExternalMemoryUsage((Recycler *)result,(ulong)type_local._4_4_);
  if (local_30 == (WebAssemblyArrayBuffer *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArrayBuffer.cpp"
                                ,0x41f,"(result)","result");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return local_30;
}

Assistant:

WebAssemblyArrayBuffer* WebAssemblyArrayBuffer::Create(byte* buffer, uint32 length, DynamicType * type)
    {
        Recycler* recycler = type->GetScriptContext()->GetRecycler();
        WebAssemblyArrayBuffer* result = nullptr;
        if (buffer)
        {
            result = RecyclerNewFinalized(recycler, WebAssemblyArrayBuffer, buffer, length, type);
        }
        else
        {
#if ENABLE_FAST_ARRAYBUFFER
            if (CONFIG_FLAG(WasmFastArray))
            {
                result = RecyclerNewFinalized(recycler, WebAssemblyArrayBuffer, length, type, WasmVirtualAllocator);
            }
            else
#endif
            {
                result = RecyclerNewFinalized(recycler, WebAssemblyArrayBuffer, length, type);
            }
        }

        recycler->AddExternalMemoryUsage(length);
        Assert(result);
        return result;
    }